

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

int32 __thiscall rw::MaterialList::appendMaterial(MaterialList *this,Material *mat)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Material **ppMVar4;
  
  iVar2 = this->numMaterials;
  iVar3 = this->space;
  ppMVar4 = this->materials;
  if (iVar3 <= iVar2) {
    lVar1 = (long)iVar3 * 8 + 0xa0;
    if (ppMVar4 == (Material **)0x0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 745"
      ;
      ppMVar4 = (Material **)(*Engine::memfuncs)(lVar1,0x30007);
    }
    else {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 743"
      ;
      ppMVar4 = (Material **)(*DAT_00144d98)(ppMVar4,lVar1,0x30007);
    }
    if (ppMVar4 == (Material **)0x0) {
      return -1;
    }
    this->space = iVar3 + 0x14;
    this->materials = ppMVar4;
    iVar2 = this->numMaterials;
  }
  this->numMaterials = iVar2 + 1;
  ppMVar4[iVar2] = mat;
  mat->refCount = mat->refCount + 1;
  return iVar2;
}

Assistant:

int32
MaterialList::appendMaterial(Material *mat)
{
	Material **ml;
	int32 space;
	if(this->numMaterials >= this->space){
		space = this->space + 20;
		if(this->materials)
			ml = rwReallocT(Material*, this->materials, space,
						MEMDUR_EVENT | ID_MATERIAL);
		else
			ml = rwMallocT(Material*, space, MEMDUR_EVENT | ID_MATERIAL);
		if(ml == nil)
			return -1;
		this->space = space;
		this->materials = ml;
	}
	this->materials[this->numMaterials++] = mat;
	mat->addRef();
	return this->numMaterials-1;
}